

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O1

void Image_Function::
     OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t *width,uint32_t *height,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args,ImageTemplate<unsigned_char> *args_1)

{
  uint32_t width_00;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  EVP_PKEY_CTX *src;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  width_00 = *width;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  local_58._data = (uchar *)0x0;
  local_58._type = args->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy
            (&local_58,(EVP_PKEY_CTX *)args,(EVP_PKEY_CTX *)image);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
  local_80._data = (uchar *)0x0;
  local_80._type = args_1->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)args_1,src);
  bVar3 = IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                    (width_00,image,&local_58,&local_80);
  if (bVar3) {
    uVar1 = *width;
    uVar2 = *height;
    local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
    local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
    if (uVar1 < (uint)(0xffffffff / (ulong)uVar2)) {
      *width = *height * *width;
      *height = 1;
    }
  }
  else {
    local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
    local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00119d28;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  }
  return;
}

Assistant:

void OptimiseRoi( uint32_t & width, uint32_t & height, const TImage & image, Args... args )
    {
        if( IsFullImageRow(width, image, args...) && ( width < (std::numeric_limits<uint32_t>::max() / height) ) ) {
            width = width * height;
            height = 1u;
        }
    }